

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 extraout_RAX;
  mapped_type *ppcVar4;
  size_t sVar5;
  ostream *poVar6;
  ulong uVar7;
  pointer __k;
  bool bVar8;
  double dVar9;
  unsigned_long systemLoad;
  uint local_22c;
  string local_228;
  ulong local_208;
  ulong local_200;
  SystemInformation info;
  ulong local_1f0;
  TestList copy;
  string testWithMinProcessors;
  string fake_load_value;
  
  local_200 = this->ParallelLevel;
  bVar8 = this->RunningCount <= local_200;
  local_208 = local_200 - this->RunningCount;
  uVar7 = 0;
  if (bVar8) {
    uVar7 = local_208;
  }
  if ((bVar8 && local_208 != 0) && (this->SerialTestRunning == false)) {
    testWithMinProcessors._M_dataplus._M_p = (pointer)&testWithMinProcessors.field_2;
    testWithMinProcessors._M_string_length = 0;
    testWithMinProcessors.field_2._M_local_buf[0] = '\0';
    cmsys::SystemInformation::SystemInformation(&info);
    systemLoad = 0;
    bVar8 = this->TestLoad == 0;
    local_22c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar8);
    if (bVar8) {
      bVar8 = false;
      local_1f0 = 0;
    }
    else {
      fake_load_value._M_dataplus._M_p = (pointer)&fake_load_value.field_2;
      fake_load_value._M_string_length = 0;
      fake_load_value.field_2._M_local_buf[0] = '\0';
      bVar8 = cmsys::SystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",&fake_load_value);
      if (bVar8) {
        bVar2 = cmSystemTools::StringToULong(fake_load_value._M_dataplus._M_p,&systemLoad);
        if (!bVar2) {
          cmSystemTools::Error
                    ("Failed to parse fake load value: ",fake_load_value._M_dataplus._M_p,
                     (char *)0x0,(char *)0x0);
        }
      }
      else {
        dVar9 = cmsys::SystemInformation::GetLoadAverage(&info);
        dVar9 = ceil(dVar9);
        systemLoad = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
      }
      local_1f0 = 0;
      if (systemLoad <= this->TestLoad) {
        local_1f0 = this->TestLoad - systemLoad;
      }
      if (local_1f0 <= uVar7) {
        uVar7 = local_1f0;
      }
      std::__cxx11::string::~string((string *)&fake_load_value);
      local_208 = uVar7;
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&copy.super_vector<int,_std::allocator<int>_>,
               &(this->SortedTests).super_vector<int,_std::allocator<int>_>);
    __k = copy.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
          ._M_impl.super__Vector_impl_data._M_start;
    while ((__k != copy.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish && (this->SerialTestRunning == false))) {
      ppcVar4 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,__k);
      if (((*ppcVar4)->RunSerial != true) || (uVar7 = local_208, this->RunningCount == 0)) {
        sVar5 = GetProcessorsUsed(this,*__k);
        if (this->TestLoad == 0) {
LAB_00343182:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (sVar5 <= local_1f0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fake_load_value);
            poVar6 = std::operator<<((ostream *)&fake_load_value,"OK to run ");
            GetName_abi_cxx11_(&local_228,this,*__k);
            poVar6 = std::operator<<(poVar6,(string *)&local_228);
            poVar6 = std::operator<<(poVar6,", it requires ");
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            poVar6 = std::operator<<(poVar6," procs & system load is: ");
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&local_228);
            pcVar1 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x138,local_228._M_dataplus._M_p,false);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fake_load_value);
            local_22c = 0;
            goto LAB_00343182;
          }
        }
        if (sVar5 <= local_200) {
          GetName_abi_cxx11_(&fake_load_value,this,*__k);
          std::__cxx11::string::operator=
                    ((string *)&testWithMinProcessors,(string *)&fake_load_value);
          std::__cxx11::string::~string((string *)&fake_load_value);
          local_200 = sVar5;
        }
        uVar7 = local_208 - sVar5;
        if ((bVar2 || local_208 < sVar5) || (bVar2 = StartTest(this,*__k), !bVar2)) {
          uVar7 = local_208;
          if (local_208 == 0) break;
        }
        else if (this->StopTimePassed != false) goto LAB_00343462;
      }
      local_208 = uVar7;
      __k = __k + 1;
    }
    if ((local_22c & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fake_load_value);
      std::operator<<((ostream *)&fake_load_value,"***** WAITING, ");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x150,local_228._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fake_load_value);
      if (this->SerialTestRunning == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fake_load_value);
        std::operator<<((ostream *)&fake_load_value,"Waiting for RUN_SERIAL test to finish.");
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x153,local_228._M_dataplus._M_p,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fake_load_value);
        poVar6 = std::operator<<((ostream *)&fake_load_value,"System Load: ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,", Max Allowed Load: ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,", Smallest test ");
        poVar6 = std::operator<<(poVar6,(string *)&testWithMinProcessors);
        poVar6 = std::operator<<(poVar6," requires ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x15a,local_228._M_dataplus._M_p,false);
      }
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fake_load_value);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fake_load_value);
      poVar6 = std::operator<<((ostream *)&fake_load_value,"*****");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x15d,local_228._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fake_load_value);
      if (bVar8 == false) {
        uVar3 = cmSystemTools::RandomSeed();
        cmCTestScriptHandler::SleepInSeconds(uVar3 % 5 + 1);
      }
      else {
        this->StopTimePassed = true;
      }
    }
LAB_00343462:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&copy);
    cmsys::SystemInformation::~SystemInformation(&info);
    std::__cxx11::string::~string((string *)&testWithMinProcessors);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  size_t numToStart = 0;
  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  bool usedFakeLoadForTesting = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    std::string fake_load_value;
    if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                              fake_load_value)) {
      usedFakeLoadForTesting = true;
      if (!cmSystemTools::StringToULong(fake_load_value.c_str(),
                                        &systemLoad)) {
        cmSystemTools::Error("Failed to parse fake load value: ",
                             fake_load_value.c_str());
      }
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (TestList::iterator test = copy.begin(); test != copy.end(); ++test) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[*test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(*test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG, "OK to run "
                     << GetName(*test) << ", it requires " << processors
                     << " procs & system load is: " << systemLoad
                     << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(*test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(*test)) {
      if (this->StopTimePassed) {
        return;
      }

      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");
    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    if (usedFakeLoadForTesting) {
      // Break out of the infinite loop of waiting for our fake load
      // to come down.
      this->StopTimePassed = true;
    } else {
      // Wait between 1 and 5 seconds before trying again.
      cmCTestScriptHandler::SleepInSeconds(cmSystemTools::RandomSeed() % 5 +
                                           1);
    }
  }
}